

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O0

bool __thiscall curlpp::Multi::perform(Multi *this,int *nbHandles)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_stack_00000008;
  RuntimeError *in_stack_00000010;
  CURLMcode code;
  bool local_1;
  
  iVar1 = curl_multi_perform(*in_RDI,in_RSI);
  if (iVar1 == -1) {
    local_1 = false;
  }
  else {
    if (iVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x10);
      curl_multi_strerror(iVar1);
      RuntimeError::RuntimeError(in_stack_00000010,in_stack_00000008);
      __cxa_throw(uVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
curlpp::Multi::perform(int * nbHandles)
{
  CURLMcode code = curl_multi_perform(mMultiHandle, nbHandles);
  if(code == CURLM_CALL_MULTI_PERFORM) {
    return false;
  }

  if(code != CURLM_OK) {
    throw curlpp::RuntimeError(curl_multi_strerror(code));
  }

  return true;
}